

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledImage.cpp
# Opt level: O1

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledImageInstancer::InstanceDecorator
          (DecoratorTiledImageInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  Tile *pTVar1;
  Texture texture_00;
  bool bVar2;
  int iVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Tile *pTVar6;
  Tile *pTVar7;
  DecoratorInstancerInterface *in_R8;
  byte bVar8;
  SharedPtr<Decorator> SVar9;
  SharedPtr<Rml::DecoratorTiledImage> decorator;
  Texture texture;
  Tile tile;
  undefined1 local_99;
  DecoratorTiledImage *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  Texture local_88;
  Tile local_74;
  
  bVar8 = 0;
  DecoratorTiled::Tile::Tile(&local_74);
  local_88.render_manager = (RenderManager *)0x0;
  local_88.file_index = Invalid;
  local_88.callback_index = Invalid;
  bVar2 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,&local_74,&local_88,1,
                     (PropertyDictionary *)instancer_interface,in_R8);
  if (bVar2) {
    local_98 = (DecoratorTiledImage *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::DecoratorTiledImage,std::allocator<Rml::DecoratorTiledImage>>
              (&local_90,&local_98,(allocator<Rml::DecoratorTiledImage> *)&local_99);
    texture_00.file_index = local_88.file_index;
    texture_00.callback_index = local_88.callback_index;
    texture_00.render_manager = local_88.render_manager;
    pTVar1 = &local_98->tile;
    pTVar6 = &local_74;
    pTVar7 = pTVar1;
    for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
      pTVar7->texture_index = pTVar6->texture_index;
      pTVar6 = (Tile *)((long)pTVar6 + ((ulong)bVar8 * -2 + 1) * 4);
      pTVar7 = (Tile *)((long)pTVar7 + (ulong)bVar8 * -8 + 4);
    }
    iVar3 = Decorator::AddTexture((Decorator *)local_98,texture_00);
    _Var5._M_pi = local_90._M_pi;
    pTVar1->texture_index = iVar3;
    if (iVar3 < 0) {
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
           (_func_int **)local_98;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
      properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var5._M_pi;
      local_98 = (DecoratorTiledImage *)0x0;
    }
    _Var5._M_pi = extraout_RDX_00;
    if (local_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90._M_pi);
      _Var5._M_pi = extraout_RDX_01;
    }
  }
  else {
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer._vptr_DecoratorInstancer =
         (_func_int **)0x0;
    (this->super_DecoratorTiledInstancer).super_DecoratorInstancer.super_EffectSpecification.
    properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    _Var5._M_pi = extraout_RDX;
  }
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar9.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledImageInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	DecoratorTiled::Tile tile;
	Texture texture;

	if (!GetTileProperties(&tile, &texture, 1, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledImage>();

	if (!decorator->Initialise(tile, texture))
		return nullptr;

	return decorator;
}